

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sophia_interface.cpp
# Opt level: O0

dec_proc2_output __thiscall
sophia_interface::dec_proc2(sophia_interface *this,double x,int IRES,int L0)

{
  code *pcVar1;
  dec_proc2_output dVar2;
  int iVar3;
  int iVar4;
  runtime_error local_1c8 [16];
  runtime_error local_1b8 [16];
  runtime_error local_1a8 [16];
  runtime_error local_198 [16];
  runtime_error local_188 [16];
  runtime_error local_178 [16];
  runtime_error local_168 [16];
  runtime_error local_158 [20];
  int local_144;
  int local_140;
  int j_1;
  int i_1;
  int ie_1;
  int istart_1;
  int nlim_1;
  double r_1;
  runtime_error local_118 [16];
  runtime_error local_108 [16];
  runtime_error local_f8 [16];
  runtime_error local_e8 [16];
  runtime_error local_d8 [16];
  runtime_error local_c8 [16];
  int local_b8;
  int local_b4;
  int j;
  int i;
  double reslimp2;
  double reslimp1;
  int local_98;
  int ie;
  int istart;
  int nlim;
  double r;
  double prob_sum [10];
  int local_30;
  int local_2c;
  int IRANGE;
  int IPROC;
  int L0_local;
  int IRES_local;
  double x_local;
  sophia_interface *this_local;
  dec_proc2_output dpo;
  
  local_30 = 0;
  memset(&r,0,0x50);
  if (L0 == 0xd) {
    _istart = RNDM(this);
    ie = ELIMITSp[IRES + -1];
    local_98 = (IRES + -1) * 4 + 1;
    iVar3 = local_98;
    if (ie < 1) {
      local_30 = 1;
    }
    else {
      while (reslimp1._4_4_ = iVar3, reslimp1._4_4_ < ie + local_98 + -1) {
        reslimp2 = RESLIMp[reslimp1._4_4_ + -1];
        _j = RESLIMp[reslimp1._4_4_];
        if ((x <= _j) && (reslimp2 < x)) {
          local_30 = (reslimp1._4_4_ + 1) - local_98;
        }
        iVar3 = reslimp1._4_4_ + 1;
      }
    }
    local_2c = -1;
    local_b4 = 0;
    local_b8 = 0;
    r = 0.0;
    if (local_30 == 1) {
      local_b8 = IDBRES1p[IRES + -1] + -1;
      if (local_b8 == -1) {
        std::runtime_error::runtime_error(local_c8,"invalid resonance in energy range 1");
        std::runtime_error::~runtime_error(local_c8);
      }
      do {
        iVar3 = local_b8 + 1;
        iVar4 = local_b4 + 1;
        prob_sum[(long)iVar4 + -1] = CBRRES1p[local_b8];
        if ((prob_sum[(long)local_b4 + -1] <= _istart) && (_istart < prob_sum[(long)iVar4 + -1])) {
          local_2c = iVar3;
        }
        local_b8 = iVar3;
        local_b4 = iVar4;
      } while (prob_sum[(long)iVar4 + -1] <= 1.0 && prob_sum[(long)iVar4 + -1] != 1.0);
      if ((_istart == 1.0) && (!NAN(_istart))) {
        local_2c = iVar3;
      }
      if (local_2c == -1) {
        std::runtime_error::runtime_error(local_d8,"no resonance decay possible !");
        std::runtime_error::~runtime_error(local_d8);
      }
    }
    else if (local_30 == 2) {
      local_b8 = IDBRES2p[IRES + -1] + -1;
      if (local_b8 == -1) {
        std::runtime_error::runtime_error(local_e8,"invalid resonance in energy range 2");
        std::runtime_error::~runtime_error(local_e8);
      }
      do {
        iVar3 = local_b8 + 1;
        iVar4 = local_b4 + 1;
        prob_sum[(long)iVar4 + -1] = CBRRES2p[local_b8];
        if ((prob_sum[(long)local_b4 + -1] <= _istart) && (_istart < prob_sum[(long)iVar4 + -1])) {
          local_2c = iVar3;
        }
        local_b8 = iVar3;
        local_b4 = iVar4;
      } while (prob_sum[(long)iVar4 + -1] <= 1.0 && prob_sum[(long)iVar4 + -1] != 1.0);
      if ((_istart == 1.0) && (!NAN(_istart))) {
        local_2c = iVar3;
      }
      if (local_2c == -1) {
        std::runtime_error::runtime_error(local_f8,"no resonance decay possible !");
        std::runtime_error::~runtime_error(local_f8);
      }
    }
    else if (local_30 == 3) {
      local_b8 = IDBRES3p[IRES + -1] + -1;
      if (local_b8 == -1) {
        std::runtime_error::runtime_error(local_108,"invalid resonance in energy range 3");
        std::runtime_error::~runtime_error(local_108);
      }
      do {
        iVar3 = local_b8 + 1;
        iVar4 = local_b4 + 1;
        prob_sum[(long)iVar4 + -1] = CBRRES3p[local_b8];
        if ((prob_sum[(long)local_b4 + -1] <= _istart) && (_istart < prob_sum[(long)iVar4 + -1])) {
          local_2c = iVar3;
        }
        local_b8 = iVar3;
        local_b4 = iVar4;
      } while (prob_sum[(long)iVar4 + -1] <= 1.0 && prob_sum[(long)iVar4 + -1] != 1.0);
      if ((_istart == 1.0) && (!NAN(_istart))) {
        local_2c = iVar3;
      }
      if (local_2c == -1) {
        std::runtime_error::runtime_error(local_118,"no resonance decay possible !");
        std::runtime_error::~runtime_error(local_118);
      }
    }
    else {
      std::runtime_error::runtime_error((runtime_error *)&r_1,"invalid IRANGE in DEC_PROC2");
      std::runtime_error::~runtime_error((runtime_error *)&r_1);
    }
    this_local._0_4_ = local_2c;
    this_local._4_4_ = local_30;
  }
  else {
    if (L0 != 0xe) {
      std::runtime_error::runtime_error(local_1c8,"no valid L0 in DEC_PROC !");
      std::runtime_error::~runtime_error(local_1c8);
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    _istart_1 = RNDM(this);
    ie_1 = ELIMITSn[IRES + -1];
    i_1 = (IRES + -1) * 4 + 1;
    iVar3 = i_1;
    if (ie_1 < 1) {
      local_30 = 1;
    }
    else {
      while (j_1 = iVar3, j_1 < ie_1 + i_1 + -1) {
        if ((x <= RESLIMn[j_1]) && (RESLIMn[j_1 + -1] <= x && x != RESLIMn[j_1 + -1])) {
          local_30 = (j_1 + 1) - i_1;
        }
        iVar3 = j_1 + 1;
      }
    }
    local_2c = -1;
    local_140 = 0;
    local_144 = 0;
    r = 0.0;
    if (local_30 == 1) {
      local_144 = IDBRES1n[IRES + -1] + -1;
      if (local_144 == -1) {
        std::runtime_error::runtime_error(local_158,"invalid resonance in this energy range");
        std::runtime_error::~runtime_error(local_158);
      }
      do {
        iVar3 = local_144 + 1;
        iVar4 = local_140 + 1;
        prob_sum[(long)iVar4 + -1] = CBRRES1n[local_144];
        if ((prob_sum[(long)local_140 + -1] <= _istart_1) &&
           (_istart_1 < prob_sum[(long)iVar4 + -1])) {
          local_2c = iVar3;
        }
        local_144 = iVar3;
        local_140 = iVar4;
      } while (prob_sum[(long)iVar4 + -1] <= 1.0 && prob_sum[(long)iVar4 + -1] != 1.0);
      if ((_istart_1 == 1.0) && (!NAN(_istart_1))) {
        local_2c = iVar3;
      }
      if (local_2c == -1) {
        std::runtime_error::runtime_error(local_168,"no resonance decay possible !");
        std::runtime_error::~runtime_error(local_168);
      }
    }
    else if (local_30 == 2) {
      local_144 = IDBRES2n[IRES + -1] + -1;
      if (local_144 == -1) {
        std::runtime_error::runtime_error(local_178,"invalid resonance in this energy range");
        std::runtime_error::~runtime_error(local_178);
      }
      do {
        iVar3 = local_144 + 1;
        iVar4 = local_140 + 1;
        prob_sum[(long)iVar4 + -1] = CBRRES2n[local_144];
        if ((prob_sum[(long)local_140 + -1] <= _istart_1) &&
           (_istart_1 < prob_sum[(long)iVar4 + -1])) {
          local_2c = iVar3;
        }
        local_144 = iVar3;
        local_140 = iVar4;
      } while (prob_sum[(long)iVar4 + -1] <= 1.0 && prob_sum[(long)iVar4 + -1] != 1.0);
      if ((_istart_1 == 1.0) && (!NAN(_istart_1))) {
        local_2c = iVar3;
      }
      if (local_2c == -1) {
        std::runtime_error::runtime_error(local_188,"no resonance decay possible !");
        std::runtime_error::~runtime_error(local_188);
      }
    }
    else if (local_30 == 3) {
      local_144 = IDBRES3n[IRES + -1] + -1;
      if (local_144 == -1) {
        std::runtime_error::runtime_error(local_198,"invalid resonance in this energy range");
        std::runtime_error::~runtime_error(local_198);
      }
      do {
        iVar3 = local_144 + 1;
        iVar4 = local_140 + 1;
        prob_sum[(long)iVar4 + -1] = CBRRES3n[local_144];
        if ((prob_sum[(long)local_140 + -1] <= _istart_1) &&
           (_istart_1 < prob_sum[(long)iVar4 + -1])) {
          local_2c = iVar3;
        }
        local_144 = iVar3;
        local_140 = iVar4;
      } while (prob_sum[(long)iVar4 + -1] <= 1.0 && prob_sum[(long)iVar4 + -1] != 1.0);
      if ((_istart_1 == 1.0) && (!NAN(_istart_1))) {
        local_2c = iVar3;
      }
      if (local_2c == -1) {
        std::runtime_error::runtime_error(local_1a8,"no resonance decay possible !");
        std::runtime_error::~runtime_error(local_1a8);
      }
    }
    else {
      std::runtime_error::runtime_error(local_1b8,"invalid IRANGE in DEC_PROC2");
      std::runtime_error::~runtime_error(local_1b8);
    }
    this_local._0_4_ = local_2c;
    this_local._4_4_ = local_30;
  }
  dVar2.IRANGE = this_local._4_4_;
  dVar2.IPROC = (int)this_local;
  return dVar2;
}

Assistant:

dec_proc2_output sophia_interface::dec_proc2(double x, int IRES, int L0) {
// decide which decay with ID=IPROC of resonance IRES takes place ***
// Date: 20/01/98   **
// correct.: 27/04/98*
// author: A.Muecke **
    int IPROC = 0;
    int IRANGE = 0;
    double prob_sum[10] = {0.};

    // choose arrays /S_RESp/ for charged resonances,
    //        arrays /S_RESn/ for neutral resonances
    if (L0 == 13) {
        // charged resonances:
        double r = RNDM();
        // determine the energy range of the resonance:
        int nlim = ELIMITSp[IRES - 1];
        int istart = (IRES - 1) * 4 + 1;
        if (nlim > 0) {
            for (int ie = istart; ie < nlim - 2 + istart + 1; ++ie) {
                double reslimp1 = RESLIMp[ie - 1];
                double reslimp2 = RESLIMp[ie];
                if (x <= reslimp2 && x > reslimp1) {
                    IRANGE = ie + 1 - istart;
                }
            }
        } else {
            IRANGE = 1;
        }

        IPROC = -1;
        int i = 0;
        int j = 0;
        prob_sum[0] = 0.;
        if (IRANGE == 1) {
            j = IDBRES1p[IRES - 1] - 1;
            if (j == -1) {
                std::runtime_error("invalid resonance in energy range 1");
            }
            do {
                j++;
                i++;
                prob_sum[i] = CBRRES1p[j - 1];
                if (r >= prob_sum[i - 1] && r < prob_sum[i]) IPROC = j;
            } while (prob_sum[i] < 1.);
            if (r == 1.) IPROC = j;
            if (IPROC == -1) {
                std::runtime_error("no resonance decay possible !");
            }
        } else if (IRANGE == 2) {
            j = IDBRES2p[IRES - 1] - 1;
            if (j == -1) {
                std::runtime_error("invalid resonance in energy range 2");
            }
            do {
                j++;
                i++;
                prob_sum[i] = CBRRES2p[j - 1];
                if (r >= prob_sum[i - 1] && r < prob_sum[i]) IPROC = j;
            } while (prob_sum[i] < 1.);
            if (r == 1.) IPROC = j;
            if (IPROC == -1) {
                std::runtime_error("no resonance decay possible !");
            }
        } else if (IRANGE == 3) {
            j = IDBRES3p[IRES - 1] - 1;
            if (j == -1) {
                std::runtime_error("invalid resonance in energy range 3");
            }
            do {
                j++;
                i++;
                prob_sum[i] = CBRRES3p[j - 1];
                if (r >= prob_sum[i - 1] && r < prob_sum[i]) IPROC = j;
            } while (prob_sum[i] < 1.);
            if (r == 1.) IPROC = j;
            if (IPROC == -1) {
                std::runtime_error("no resonance decay possible !");
            }
        } else {
            std::runtime_error("invalid IRANGE in DEC_PROC2");
        }
        
        // output
        dec_proc2_output dpo;
        dpo.IPROC = IPROC;
        dpo.IRANGE = IRANGE;
        return dpo;
    } else if (L0 == 14) {
        // neutral resonances:
        double r = RNDM();
        //determine the energy range of the resonance:
        int nlim = ELIMITSn[IRES - 1];
        int istart = (IRES-1) * 4 + 1;
        if (nlim > 0) {
            for (int ie = istart; ie < nlim - 2 + istart + 1; ++ie) {
                if (x <= RESLIMn[ie] && x > RESLIMn[ie - 1]) {
                    IRANGE = ie + 1 - istart;
                }
            }
        } else {
            IRANGE = 1;
        }
        IPROC = -1;
        int i = 0;
        int j = 0;
        prob_sum[0] = 0.;
        if (IRANGE == 1) {
            j = IDBRES1n[IRES - 1] - 1;
            if (j == -1) {
                std::runtime_error("invalid resonance in this energy range");
            }
            do {
                j++;
                i++;
                prob_sum[i] = CBRRES1n[j - 1];
                if (r >= prob_sum[i - 1] && r < prob_sum[i]) IPROC = j;
            } while (prob_sum[i] < 1.);
                if (r == 1.) IPROC = j;
                if (IPROC == -1) {
                    std::runtime_error("no resonance decay possible !");
                }
        } else if (IRANGE == 2) {
            j = IDBRES2n[IRES - 1] - 1;
            if (j == -1) {
                std::runtime_error("invalid resonance in this energy range");
            }
            do {
                j++;
                i++;
                prob_sum[i] = CBRRES2n[j - 1];
                if (r >= prob_sum[i - 1] && r < prob_sum[i]) IPROC = j;
            } while (prob_sum[i] < 1.);
            if (r == 1.) IPROC = j;
            if (IPROC == -1) {
                std::runtime_error("no resonance decay possible !");
            }
        } else if (IRANGE == 3) {
            j = IDBRES3n[IRES - 1] - 1;
            if (j == -1) {
                std::runtime_error("invalid resonance in this energy range");
            }
            do {
                j++;
                i++;
                    prob_sum[i] = CBRRES3n[j - 1];
                if (r >= prob_sum[i - 1] && r < prob_sum[i]) IPROC = j;
            } while (prob_sum[i] < 1.);
            if (r == 1.) IPROC = j;
            if (IPROC == -1) {
                std::runtime_error("no resonance decay possible !");
            }
        } else {
            std::runtime_error("invalid IRANGE in DEC_PROC2");
        }
        // output
        dec_proc2_output dpo;
        dpo.IPROC = IPROC;
        dpo.IRANGE = IRANGE;
        return dpo;
    } else {
        std::runtime_error("no valid L0 in DEC_PROC !");
    }    
}